

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O3

LispPTR N_OP_lrsh1(LispPTR a)

{
  uint *puVar1;
  uint uVar2;
  LispPTR LVar3;
  
  if ((a & 0xfff0000) == 0xf0000) {
    uVar2 = a >> 1 | 0x7fff8000;
LAB_0012fea3:
    puVar1 = (uint *)createcell68k(2);
    *puVar1 = uVar2;
    if (((ulong)puVar1 & 1) != 0) {
      printf("Misaligned pointer in LAddrFromNative %p\n",puVar1);
    }
    LVar3 = (LispPTR)((ulong)((long)puVar1 - (long)Lisp_world) >> 1);
  }
  else {
    if ((a & 0xfff0000) == 0xe0000) {
      uVar2 = a >> 1 & 0x7fff;
    }
    else {
      if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
        MachineState.tosvalue = a;
        MachineState.errorexit = 1;
        return 0xffffffff;
      }
      if ((a & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)a);
      }
      uVar2 = *(uint *)(Lisp_world + a) >> 1;
      if (0x1ffff < *(uint *)(Lisp_world + a)) goto LAB_0012fea3;
    }
    LVar3 = uVar2 | 0xe0000;
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_lrsh1(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 = (unsigned)arg1 >> 1;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);

}